

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

QTreeWidgetItem * __thiscall QTreeWidget::currentItem(QTreeWidget *this)

{
  QTreeWidgetItem *pQVar1;
  QTreeWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetPrivate *d;
  QModelIndex *in_stack_ffffffffffffffa8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTreeWidget *)0x917f4a);
  QAbstractItemView::currentIndex((QAbstractItemView *)&stack0xffffffffffffffe0);
  pQVar1 = QTreeWidgetPrivate::item(in_RDI,in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidget::currentItem() const
{
    Q_D(const QTreeWidget);
    return d->item(currentIndex());
}